

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImDrawList *pIVar1;
  bool bVar2;
  ImU32 col;
  ImGuiCol idx;
  float radius_00;
  byte local_e1;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImU32 local_74;
  float local_70;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  float radius_local;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_50,radius,radius);
  local_48 = ::operator-(pos,&local_50);
  ImVec2::ImVec2((ImVec2 *)&center.y,radius,radius);
  local_58 = ::operator+(pos,(ImVec2 *)&center.y);
  ImRect::ImRect((ImRect *)local_40,&local_48,&local_58);
  bVar2 = ItemAdd((ImRect *)local_40,id,(ImRect *)0x0);
  center.x._3_1_ = (bVar2 ^ 0xffU) & 1;
  center.x._0_1_ =
       ButtonBehavior((ImRect *)local_40,id,(bool *)((long)&center.x + 2),
                      (bool *)((long)&center.x + 1),0);
  pos_local._7_1_ = (bool)center.x._0_1_;
  if ((center.x._3_1_ & 1) == 0) {
    _cross_col = ImRect::GetCenter((ImRect *)local_40);
    if ((center.x._2_1_ & 1) != 0) {
      pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
      radius_00 = ImMax<float>(2.0,radius);
      local_e1 = 0;
      if ((center.x._1_1_ & 1) != 0) {
        local_e1 = center.x._2_1_;
      }
      idx = 0x16;
      if ((local_e1 & 1) != 0) {
        idx = 0x17;
      }
      col = GetColorU32(idx,1.0);
      ImDrawList::AddCircleFilled(pIVar1,(ImVec2 *)&cross_col,radius_00,col,9);
    }
    local_70 = radius * 0.7071 + -1.0;
    local_74 = GetColorU32(0,1.0);
    ImVec2::ImVec2(&local_7c,0.5,0.5);
    operator-=((ImVec2 *)&cross_col,&local_7c);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
    ImVec2::ImVec2(&local_8c,local_70,local_70);
    local_84 = ::operator+((ImVec2 *)&cross_col,&local_8c);
    ImVec2::ImVec2(&local_9c,-local_70,-local_70);
    local_94 = ::operator+((ImVec2 *)&cross_col,&local_9c);
    ImDrawList::AddLine(pIVar1,&local_84,&local_94,local_74,1.0);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
    ImVec2::ImVec2(&local_ac,local_70,-local_70);
    local_a4 = ::operator+((ImVec2 *)&cross_col,&local_ac);
    ImVec2::ImVec2(&local_bc,-local_70,local_70);
    local_b4 = ::operator+((ImVec2 *)&cross_col,&local_bc);
    ImDrawList::AddLine(pIVar1,&local_a4,&local_b4,local_74,1.0);
    pos_local._7_1_ = (bool)(center.x._0_1_ & 1);
  }
  return pos_local._7_1_;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered), 9);

    float cross_extent = (radius * 0.7071f) - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}